

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined1 local_208 [16];
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_write_t write_req;
  
  init_process_options("spawn_helper3",exit_cb);
  uVar2 = uv_default_loop();
  uv_pipe_init(uVar2,(uv_stream_t *)&in,0);
  options.stdio = stdio;
  stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  stdio[0].data.stream = (uv_stream_t *)&in;
  close(0);
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    local_208 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    iVar1 = uv_write(&write_req,&in,local_208,1,write_cb);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,0);
      if (iVar1 == 0) {
        if (exit_cb_called == 1) {
          if (close_cb_called == 2) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0x408;
          }
          else {
            pcVar3 = "close_cb_called == 2";
            uVar2 = 0x406;
          }
        }
        else {
          pcVar3 = "exit_cb_called == 1";
          uVar2 = 0x405;
        }
      }
      else {
        pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar2 = 0x403;
      }
    }
    else {
      pcVar3 = "0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb)";
      uVar2 = 0x401;
    }
  }
  else {
    pcVar3 = "0 == uv_spawn(uv_default_loop(), &process, &options)";
    uVar2 = 0x3fe;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* process, child stdin */

  MAKE_VALGRIND_HAPPY();
  return 0;
}